

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

string_t duckdb::DecimalToString::Format<short>
                   (short value,uint8_t width,uint8_t scale,Vector *vector)

{
  int val;
  Vector *vector_00;
  ulong uVar1;
  char *dst;
  idx_t len;
  string_t sVar2;
  string_t result;
  undefined1 local_38 [16];
  
  val = DecimalLength<short>(value,width,scale);
  vector_00 = (Vector *)NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  local_38 = (undefined1  [16])StringVector::EmptyString((StringVector *)vector,vector_00,len);
  dst = local_38._8_8_;
  if (local_38._0_4_ < 0xd) {
    dst = local_38 + 4;
  }
  FormatDecimal<short>(value,width,scale,dst,(long)val);
  uVar1 = (ulong)(uint)local_38._0_4_;
  if (uVar1 < 0xd) {
    switchD_012e3010::default(local_38 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_38._4_4_ = *(undefined4 *)local_38._8_8_;
  }
  sVar2.value.pointer.ptr = (char *)local_38._8_8_;
  sVar2.value._0_8_ = local_38._0_8_;
  return (string_t)sVar2.value;
}

Assistant:

static string_t Format(SIGNED value, uint8_t width, uint8_t scale, Vector &vector) {
		int len = DecimalLength<SIGNED>(value, width, scale);
		string_t result = StringVector::EmptyString(vector, NumericCast<size_t>(len));
		FormatDecimal<SIGNED>(value, width, scale, result.GetDataWriteable(), UnsafeNumericCast<idx_t>(len));
		result.Finalize();
		return result;
	}